

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSwitch.c
# Opt level: O0

void Gia_ManSwiSimInfoTransferShift(Gia_ManSwi_t *p,int nProbNum)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint *puVar4;
  uint *pInfo0;
  int local_18;
  int nShift;
  int i;
  int nProbNum_local;
  Gia_ManSwi_t *p_local;
  
  local_18 = 0;
  iVar1 = Gia_ManPoNum(p->pAig);
  iVar2 = Gia_ManPiNum(p->pAig);
  for (; iVar3 = Gia_ManPiNum(p->pAig), local_18 < iVar3; local_18 = local_18 + 1) {
    puVar4 = Gia_SwiDataCi(p,local_18);
    Gia_ManSwiSimInfoRandomShift(p,puVar4,nProbNum);
  }
  for (; iVar3 = Gia_ManCiNum(p->pAig), local_18 < iVar3; local_18 = local_18 + 1) {
    puVar4 = Gia_SwiDataCi(p,local_18);
    pInfo0 = Gia_SwiDataCo(p,(iVar1 - iVar2) + local_18);
    Gia_ManSwiSimInfoCopyShift(p,puVar4,pInfo0);
  }
  return;
}

Assistant:

static inline void Gia_ManSwiSimInfoTransferShift( Gia_ManSwi_t * p, int nProbNum )
{
    int i = 0, nShift = Gia_ManPoNum(p->pAig)-Gia_ManPiNum(p->pAig);
    for ( ; i < Gia_ManPiNum(p->pAig); i++ )
        Gia_ManSwiSimInfoRandomShift( p, Gia_SwiDataCi(p, i), nProbNum );
    for ( ; i < Gia_ManCiNum(p->pAig); i++ )
        Gia_ManSwiSimInfoCopyShift( p, Gia_SwiDataCi(p, i), Gia_SwiDataCo(p, nShift+i) );
}